

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O2

int retry_control_should_retry(RETRY_CONTROL_HANDLE retry_control_handle,RETRY_ACTION *retry_action)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  time_t tVar3;
  int iVar4;
  RETRY_CONTROL_INSTANCE *retry_control;
  char *pcVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  if (retry_control_handle == (RETRY_CONTROL_HANDLE)0x0 || retry_action == (RETRY_ACTION *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_should_retry",0x15c,1,
                "Failed to evaluate if retry should be attempted (either retry_control_handle (%p) or retry_action (%p) are NULL)"
                ,retry_control_handle,retry_action);
      return 0x15d;
    }
    return 0x15d;
  }
  if (retry_control_handle->policy == IOTHUB_CLIENT_RETRY_NONE) {
LAB_00142605:
    *retry_action = RETRY_ACTION_STOP_RETRYING;
    return 0;
  }
  if (retry_control_handle->first_retry_tick_seconds == -1) {
    tVar3 = retry_get_tick_seconds(retry_control_handle);
    retry_control_handle->first_retry_tick_seconds = tVar3;
    if (tVar3 == -1) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x16b;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x16b;
      }
      pcVar5 = "Failed to evaluate if retry should be attempted (retry_get_tick_seconds() failed)";
      iVar4 = 0x16a;
      goto LAB_00142729;
    }
  }
  if (retry_control_handle->retry_count != 0) {
    if ((retry_control_handle->last_retry_tick_seconds == -1) &&
       (retry_control_handle->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar5 = "Failed to evaluate retry action (last_retry_tick_second is INDEFINITE_TIME)";
        iVar1 = 0x7e;
LAB_001426ee:
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                  ,"evaluate_retry_action",iVar1,1,pcVar5);
      }
    }
    else {
      tVar3 = retry_get_tick_seconds(retry_control_handle);
      if (tVar3 != -1) {
        if ((retry_control_handle->max_retry_time_in_secs != 0) &&
           (dVar7 = get_difftime(tVar3,retry_control_handle->first_retry_tick_seconds),
           (double)retry_control_handle->max_retry_time_in_secs <= dVar7)) goto LAB_00142605;
        if ((retry_control_handle->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE) &&
           (dVar7 = get_difftime(tVar3,retry_control_handle->last_retry_tick_seconds),
           dVar7 < (double)retry_control_handle->current_wait_time_in_secs)) {
          *retry_action = RETRY_ACTION_RETRY_LATER;
          return 0;
        }
        goto LAB_00142613;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar5 = "Failed to evaluate retry action (retry_get_tick_seconds() failed)";
        iVar1 = 0x87;
        goto LAB_001426ee;
      }
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x170;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x170;
    }
    pcVar5 = "Failed to evaluate if retry should be attempted (evaluate_retry_action() failed)";
    iVar4 = 0x16f;
LAB_00142729:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
              ,"retry_control_should_retry",iVar4,1,pcVar5);
    return iVar1;
  }
LAB_00142613:
  *retry_action = RETRY_ACTION_RETRY_NOW;
  retry_control_handle->retry_count = retry_control_handle->retry_count + 1;
  if (retry_control_handle->policy == IOTHUB_CLIENT_RETRY_IMMEDIATE) {
    return 0;
  }
  tVar3 = retry_get_tick_seconds(retry_control_handle);
  retry_control_handle->last_retry_tick_seconds = tVar3;
  switch(retry_control_handle->policy) {
  case IOTHUB_CLIENT_RETRY_INTERVAL:
    uVar6 = retry_control_handle->initial_wait_time_in_secs;
    break;
  case IOTHUB_CLIENT_RETRY_LINEAR_BACKOFF:
    uVar6 = retry_control_handle->retry_count * retry_control_handle->initial_wait_time_in_secs;
    if (retry_control_handle->max_delay_in_secs <= uVar6) {
      uVar6 = retry_control_handle->max_delay_in_secs;
    }
    break;
  case IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF:
    dVar8 = exp2((double)(retry_control_handle->retry_count - 1));
    dVar8 = (double)retry_control_handle->initial_wait_time_in_secs * dVar8;
    dVar7 = (double)retry_control_handle->max_delay_in_secs;
    if (dVar8 <= (double)retry_control_handle->max_delay_in_secs) {
      dVar7 = dVar8;
    }
    goto LAB_001427f3;
  case IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER:
    uVar6 = retry_control_handle->max_jitter_percent;
    iVar1 = rand();
    auVar9._8_8_ = (double)iVar1;
    auVar9._0_8_ = (double)uVar6;
    auVar9 = divpd(auVar9,_DAT_001a0380);
    dVar8 = exp2((double)(retry_control_handle->retry_count - 1));
    dVar8 = (double)retry_control_handle->initial_wait_time_in_secs * dVar8;
    dVar7 = (double)retry_control_handle->max_delay_in_secs;
    if (dVar8 <= (double)retry_control_handle->max_delay_in_secs) {
      dVar7 = dVar8;
    }
    dVar7 = (auVar9._8_8_ * auVar9._0_8_ + 1.0) * dVar7;
LAB_001427f3:
    uVar6 = (uint)(long)dVar7;
    break;
  case IOTHUB_CLIENT_RETRY_RANDOM:
    iVar1 = rand();
    uVar6 = (uint)(long)((double)retry_control_handle->initial_wait_time_in_secs *
                        ((double)iVar1 / 2147483647.0));
    break;
  default:
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      uVar6 = 0;
    }
    else {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"calculate_next_wait_time",0xda,1,
                "Failed to calculate the next wait time (policy %d is not expected)",
                (ulong)retry_control_handle->policy);
      uVar6 = 0;
    }
  }
  retry_control_handle->current_wait_time_in_secs = uVar6;
  return 0;
}

Assistant:

int retry_control_should_retry(RETRY_CONTROL_HANDLE retry_control_handle, RETRY_ACTION* retry_action)
{
    int result;

    if ((retry_control_handle == NULL) || (retry_action == NULL))
    {
        LogError("Failed to evaluate if retry should be attempted (either retry_control_handle (%p) or retry_action (%p) are NULL)", retry_control_handle, retry_action);
        result = MU_FAILURE;
    }
    else
    {
        RETRY_CONTROL_INSTANCE* retry_control = (RETRY_CONTROL_INSTANCE*)retry_control_handle;

        if (retry_control->policy == IOTHUB_CLIENT_RETRY_NONE)
        {
            *retry_action = RETRY_ACTION_STOP_RETRYING;
            result = RESULT_OK;
        }
        else if (retry_control->first_retry_tick_seconds == INDEFINITE_TIME && (retry_control->first_retry_tick_seconds = retry_get_tick_seconds(retry_control_handle)) == INDEFINITE_TIME)
        {
            LogError("Failed to evaluate if retry should be attempted (retry_get_tick_seconds() failed)");
            result = MU_FAILURE;
        }
        else if (evaluate_retry_action(retry_control, retry_action) != RESULT_OK)
        {
            LogError("Failed to evaluate if retry should be attempted (evaluate_retry_action() failed)");
            result = MU_FAILURE;
        }
        else
        {
            if (*retry_action == RETRY_ACTION_RETRY_NOW)
            {
                retry_control->retry_count++;

                if (retry_control->policy != IOTHUB_CLIENT_RETRY_IMMEDIATE)
                {
                    retry_control->last_retry_tick_seconds = retry_get_tick_seconds(retry_control_handle);

                    retry_control->current_wait_time_in_secs = calculate_next_wait_time(retry_control);
                }
            }

            result = RESULT_OK;
        }
    }

    return result;
}